

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void calculate_next_ppu_intr(Emulator *e)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((e->state).ppu.lcdc.display == FALSE) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = (ulong)(e->state).ppu.state_ticks + (e->state).ppu.sync_ticks;
  }
  (e->state).ppu.next_intr_ticks = uVar2;
  uVar1 = (e->state).serial.next_intr_ticks;
  uVar3 = (e->state).timer.next_intr_ticks;
  if (uVar1 < uVar3) {
    uVar3 = uVar1;
  }
  if (uVar2 <= uVar3) {
    uVar3 = uVar2;
  }
  (e->state).next_intr_ticks = uVar3;
  return;
}

Assistant:

static void calculate_next_ppu_intr(Emulator* e) {
  if (LCDC.display) {
    /* TODO: Looser bounds on sync points. This syncs at every state
     * transition, even though we often won't need to sync that often. */
    PPU.next_intr_ticks = PPU.sync_ticks + PPU.state_ticks;
  } else {
    PPU.next_intr_ticks = INVALID_TICKS;
  }
  calculate_next_intr(e);
}